

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDGraph.h
# Opt level: O0

void __thiscall dg::CDGraph::CDGraph(CDGraph *this,string *name)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::
  vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
  ::vector((vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
            *)0x234209);
  std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::set
            ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)0x234216);
  return;
}

Assistant:

CDGraph(std::string name = "") : _name(std::move(name)) {}